

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.h
# Opt level: O1

optional<bool> SettingToBool(SettingsValue *value)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  ushort uVar5;
  long in_FS_OFFSET;
  string_view str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (value->typ == VNULL) {
    bVar2 = false;
    uVar5 = 0;
  }
  else if (value->typ == VBOOL) {
    bVar2 = UniValue::get_bool(value);
    uVar5 = 0x100;
  }
  else {
    psVar4 = UniValue::get_str_abi_cxx11_(value);
    uVar5 = 0x100;
    if (psVar4->_M_string_length == 0) {
      bVar2 = true;
    }
    else {
      str._M_str = (psVar4->_M_dataplus)._M_p;
      str._M_len = psVar4->_M_string_length;
      iVar3 = LocaleIndependentAtoi<int>(str);
      bVar2 = iVar3 != 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar5 | bVar2);
  }
  __stack_chk_fail();
}

Assistant:

bool isNull() const { return (typ == VNULL); }